

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O1

void __thiscall cmFindCommon::SelectDefaultSearchModes(cmFindCommon *this)

{
  bool bVar1;
  cmValue cVar2;
  char *extraout_RDX;
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
  *__range1;
  long lVar3;
  long *plVar4;
  string *name;
  string_view value;
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
  search_paths;
  string local_110;
  bool *local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  bool *local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  bool *local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  bool *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  bool *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  name = &local_110;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)name,"CMAKE_FIND_USE_PACKAGE_ROOT_PATH","");
  local_f0 = &this->NoCMakePath;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"CMAKE_FIND_USE_CMAKE_PATH","")
  ;
  local_c8 = &this->NoCMakeEnvironmentPath;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH","");
  local_a0 = &this->NoSystemEnvironmentPath;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH","");
  local_78 = &this->NoCMakeSystemPath;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"CMAKE_FIND_USE_CMAKE_SYSTEM_PATH","");
  local_50 = &this->NoCMakeInstallPath;
  plVar4 = local_38;
  local_48[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"CMAKE_FIND_USE_INSTALL_PREFIX","");
  lVar3 = 0xf0;
  do {
    cVar2 = cmMakefile::GetDefinition(this->Makefile,name);
    if (cVar2.Value != (string *)0x0) {
      value._M_str = extraout_RDX;
      value._M_len = (size_t)((cVar2.Value)->_M_dataplus)._M_p;
      bVar1 = cmValue::IsOn((cmValue *)(cVar2.Value)->_M_string_length,value);
      *(bool *)*(undefined8 *)((long)&name[-1].field_2 + 8) = !bVar1;
    }
    name = (string *)&name[1]._M_string_length;
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != 0);
  lVar3 = -0xf0;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultSearchModes()
{
  const std::array<std::pair<bool&, std::string>, 6> search_paths = {
    { { this->NoPackageRootPath, "CMAKE_FIND_USE_PACKAGE_ROOT_PATH" },
      { this->NoCMakePath, "CMAKE_FIND_USE_CMAKE_PATH" },
      { this->NoCMakeEnvironmentPath,
        "CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH" },
      { this->NoSystemEnvironmentPath,
        "CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH" },
      { this->NoCMakeSystemPath, "CMAKE_FIND_USE_CMAKE_SYSTEM_PATH" },
      { this->NoCMakeInstallPath, "CMAKE_FIND_USE_INSTALL_PREFIX" } }
  };

  for (auto const& path : search_paths) {
    cmValue def = this->Makefile->GetDefinition(path.second);
    if (def) {
      path.first = !cmIsOn(*def);
    }
  }
}